

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration_object.c
# Opt level: O0

void configuration_object_instantiate(configuration config,value v)

{
  size_t sVar1;
  configuration config_00;
  undefined8 in_RSI;
  long in_RDI;
  char *key;
  value *tupla;
  value iterator;
  value *v_map;
  size_t size;
  size_t index;
  char *in_stack_ffffffffffffffb8;
  undefined8 local_18;
  
  sVar1 = value_type_count(in_stack_ffffffffffffffb8);
  value_to_map((value)0x12dc07);
  for (local_18 = 0; local_18 < sVar1; local_18 = local_18 + 1) {
    value_to_array((value)0x12dc3e);
    config_00 = (configuration)value_to_string((value)0x12dc50);
    configuration_object_set(config_00,in_stack_ffffffffffffffb8,(value)0x12dc6d);
  }
  *(undefined8 *)(in_RDI + 0x28) = in_RSI;
  return;
}

Assistant:

void configuration_object_instantiate(configuration config, value v)
{
	size_t index, size = value_type_count(v);

	value *v_map = value_to_map(v);

	for (index = 0; index < size; ++index)
	{
		value iterator = v_map[index];

		value *tupla = value_to_array(iterator);

		const char *key = value_to_string(tupla[0]);

		configuration_object_set(config, key, tupla[1]);
	}

	config->v = v;
}